

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_macroLetWithPrimitiveMacro
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sourcePosition;
  sysbvm_tuple_t *value;
  sysbvm_tuple_t *name;
  sysbvm_tuple_t *macroContext;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  sVar1 = sysbvm_macroContext_getSourcePosition(*arguments);
  sVar1 = sysbvm_astVariableDefinitionNode_createMacro(context,sVar1,arguments[1],0,arguments[2]);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_macroLetWithPrimitiveMacro(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_tuple_t *macroContext = &arguments[0];
    sysbvm_tuple_t *name = &arguments[1];
    sysbvm_tuple_t *value = &arguments[2];

    sysbvm_tuple_t sourcePosition = sysbvm_macroContext_getSourcePosition(*macroContext);
    return sysbvm_astVariableDefinitionNode_createMacro(context, sourcePosition, *name, SYSBVM_NULL_TUPLE, *value);
}